

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelVoidsElement::~IfcRelVoidsElement
          (IfcRelVoidsElement *this,void **vtt)

{
  void **vtt_local;
  IfcRelVoidsElement *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelVoidsElement,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelVoidsElement,_2UL> *)
             &(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8,vtt + 0x10);
  IfcRelConnects::~IfcRelConnects(&this->super_IfcRelConnects,vtt + 1);
  return;
}

Assistant:

IfcRelVoidsElement() : Object("IfcRelVoidsElement") {}